

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboSimian.cpp
# Opt level: O0

void __thiscall chrono::robosimian::RoboSimian::Translate(RoboSimian *this,ChVector<double> *shift)

{
  bool bVar1;
  element_type *this_00;
  element_type *this_01;
  __shared_ptr_access<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var2
  ;
  element_type *peVar3;
  ChVector<double> *shift_local;
  RoboSimian *this_local;
  
  this_00 = std::
            __shared_ptr_access<chrono::robosimian::RS_Chassis,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<chrono::robosimian::RS_Chassis,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->m_chassis);
  RS_Chassis::Translate(this_00,shift);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->m_sled);
  if (bVar1) {
    this_01 = std::
              __shared_ptr_access<chrono::robosimian::RS_Sled,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<chrono::robosimian::RS_Sled,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->m_sled);
    RS_Sled::Translate(this_01,shift);
  }
  p_Var2 = (__shared_ptr_access<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            *)std::
              vector<std::shared_ptr<chrono::robosimian::RS_Limb>,_std::allocator<std::shared_ptr<chrono::robosimian::RS_Limb>_>_>
              ::operator[](&this->m_limbs,0);
  peVar3 = std::
           __shared_ptr_access<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->(p_Var2);
  RS_Limb::Translate(peVar3,shift);
  p_Var2 = (__shared_ptr_access<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            *)std::
              vector<std::shared_ptr<chrono::robosimian::RS_Limb>,_std::allocator<std::shared_ptr<chrono::robosimian::RS_Limb>_>_>
              ::operator[](&this->m_limbs,1);
  peVar3 = std::
           __shared_ptr_access<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->(p_Var2);
  RS_Limb::Translate(peVar3,shift);
  p_Var2 = (__shared_ptr_access<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            *)std::
              vector<std::shared_ptr<chrono::robosimian::RS_Limb>,_std::allocator<std::shared_ptr<chrono::robosimian::RS_Limb>_>_>
              ::operator[](&this->m_limbs,2);
  peVar3 = std::
           __shared_ptr_access<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->(p_Var2);
  RS_Limb::Translate(peVar3,shift);
  p_Var2 = (__shared_ptr_access<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            *)std::
              vector<std::shared_ptr<chrono::robosimian::RS_Limb>,_std::allocator<std::shared_ptr<chrono::robosimian::RS_Limb>_>_>
              ::operator[](&this->m_limbs,3);
  peVar3 = std::
           __shared_ptr_access<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->(p_Var2);
  RS_Limb::Translate(peVar3,shift);
  return;
}

Assistant:

void RoboSimian::Translate(const ChVector<>& shift) {
    m_chassis->Translate(shift);
    if (m_sled)
        m_sled->Translate(shift);
    m_limbs[FR]->Translate(shift);
    m_limbs[RR]->Translate(shift);
    m_limbs[RL]->Translate(shift);
    m_limbs[FL]->Translate(shift);
}